

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglBufferAgeTests.cpp
# Opt level: O1

bool deqp::egl::anon_unknown_0::compareToReference
               (TestLog *log,Surface *reference,Surface *buffer,int frameNdx,int bufferNum)

{
  bool bVar1;
  ostream *poVar2;
  void *pvVar3;
  long *local_238;
  long local_228 [2];
  UVec4 local_218;
  ConstPixelBufferAccess local_208;
  IVec3 local_1dc;
  ConstPixelBufferAccess local_1d0;
  ostringstream stream;
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&stream);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&stream,"FrameNdx = ",0xb);
  poVar2 = (ostream *)std::ostream::operator<<(&stream,frameNdx);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,", compare current buffer (numbered: ",0x24);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,bufferNum);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,") to reference",0xe);
  std::__cxx11::stringbuf::str();
  local_208.m_format.order = RGBA;
  local_208.m_format.type = UNORM_INT8;
  pvVar3 = (void *)(reference->m_pixels).m_cap;
  if (pvVar3 != (void *)0x0) {
    pvVar3 = (reference->m_pixels).m_ptr;
  }
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_1d0,&local_208.m_format,reference->m_width,reference->m_height,1,pvVar3);
  local_218.m_data[0] = RGBA;
  local_218.m_data[1] = UNORM_INT8;
  pvVar3 = (void *)(buffer->m_pixels).m_cap;
  if (pvVar3 != (void *)0x0) {
    pvVar3 = (buffer->m_pixels).m_ptr;
  }
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_208,(TextureFormat *)&local_218,buffer->m_width,buffer->m_height,1,pvVar3);
  local_218.m_data[0] = RGBA;
  local_218.m_data[1] = UNORM_SHORT_565;
  local_218.m_data[2] = 8;
  local_218.m_data[3] = 0;
  local_1dc.m_data[0] = 2;
  local_1dc.m_data[1] = 2;
  local_1dc.m_data[2] = 0;
  bVar1 = tcu::intThresholdPositionDeviationCompare
                    (log,"partial update test",(char *)local_238,&local_1d0,&local_208,&local_218,
                     &local_1dc,true,COMPARE_LOG_RESULT);
  if (local_238 != local_228) {
    operator_delete(local_238,local_228[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stream);
  std::ios_base::~ios_base(local_138);
  return bVar1;
}

Assistant:

bool compareToReference (tcu::TestLog& log,	 const tcu::Surface& reference, const tcu::Surface& buffer, int frameNdx, int bufferNum)
{
	std::ostringstream stream;
	stream << "FrameNdx = " << frameNdx << ", compare current buffer (numbered: " << bufferNum << ") to reference";
	return tcu::intThresholdPositionDeviationCompare(log, "buffer age test", stream.str().c_str(), reference.getAccess(), buffer.getAccess(),
													 tcu::UVec4(8, 8, 8, 0), tcu::IVec3(2,2,0), true, tcu::COMPARE_LOG_RESULT);
}